

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O2

AnimationIndex __thiscall
QSequentialAnimationGroupPrivate::indexForCurrentTime(QSequentialAnimationGroupPrivate *this)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  parameter_type pVar4;
  int i;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  
  iVar3 = 0;
  uVar7 = 0;
  for (uVar5 = 0; uVar2 = (this->super_QAnimationGroupPrivate).animations.d.size, uVar5 < uVar2;
      uVar5 = uVar5 + 1) {
    iVar3 = animationActualTotalDuration(this,(int)uVar5);
    if (iVar3 == -1) goto LAB_0036ba34;
    uVar6 = iVar3 + uVar7;
    uVar1 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime;
    if ((int)uVar1 < (int)uVar6) goto LAB_0036ba34;
    if (uVar1 == uVar6) {
      pVar4 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
              ::value(&(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
                       direction);
      if (pVar4 == Backward) goto LAB_0036ba34;
    }
    uVar7 = uVar6;
  }
  uVar7 = uVar7 - iVar3;
  uVar5 = uVar2 + 0xffffffff;
LAB_0036ba34:
  return (AnimationIndex)(uVar5 & 0xffffffff | (ulong)uVar7 << 0x20);
}

Assistant:

QSequentialAnimationGroupPrivate::AnimationIndex QSequentialAnimationGroupPrivate::indexForCurrentTime() const
{
    Q_ASSERT(!animations.isEmpty());

    AnimationIndex ret;
    int duration = 0;

    for (int i = 0; i < animations.size(); ++i) {
        duration = animationActualTotalDuration(i);

        // 'animation' is the current animation if one of these reasons is true:
        // 1. it's duration is undefined
        // 2. it ends after msecs
        // 3. it is the last animation (this can happen in case there is at least 1 uncontrolled animation)
        // 4. it ends exactly in msecs and the direction is backwards
        if (duration == -1 || currentTime < (ret.timeOffset + duration)
            || (currentTime == (ret.timeOffset + duration) && direction == QAbstractAnimation::Backward)) {
            ret.index = i;
            return ret;
        }

        // 'animation' has a non-null defined duration and is not the one at time 'msecs'.
        ret.timeOffset += duration;
    }

    // this can only happen when one of those conditions is true:
    // 1. the duration of the group is undefined and we passed its actual duration
    // 2. there are only 0-duration animations in the group
    ret.timeOffset -= duration;
    ret.index = animations.size() - 1;
    return ret;
}